

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushID(char *str_id_begin,char *str_id_end)

{
  ImGuiWindow *this;
  ImGuiID id;
  ImGuiID local_c;
  
  this = (ImGuiWindow *)GImGui->CurrentWindow;
  local_c = ImGuiWindow::GetIDNoKeepAlive(this,str_id_begin,str_id_end);
  ImVector<unsigned_int>::push_back((ImVector<unsigned_int> *)&this->IDStack,&local_c);
  return;
}

Assistant:

void ImGui::PushID(const char* str_id_begin, const char* str_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetIDNoKeepAlive(str_id_begin, str_id_end);
    window->IDStack.push_back(id);
}